

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleon.cxx
# Opt level: O0

double trento::anon_unknown_0::numeric_partonic_cross_section(VarMap *var_map)

{
  anon_class_24_3_1e2f5a07 f;
  double *pdVar1;
  variable_value *bx;
  double *max_iter_00;
  double in_RDI;
  double dVar2;
  double dVar3;
  pair<double,_double> pVar4;
  domain_error *anon_var_0;
  double cross_section_param;
  pair<double,_double> result;
  double c;
  uintmax_t max_iter;
  eps_tolerance<double> tol;
  double b;
  double a;
  double width;
  double sigma_nn;
  MonteCarloCrossSection mc_cross_section;
  string *in_stack_fffffffffffffe38;
  variables_map *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  uint bits;
  eps_tolerance<double> *in_stack_fffffffffffffe50;
  allocator *paVar5;
  double *in_stack_fffffffffffffec0;
  allocator local_d1;
  string local_d0 [32];
  double local_b0;
  VarMap *in_stack_ffffffffffffff58;
  MonteCarloCrossSection *in_stack_ffffffffffffff60;
  allocator local_91;
  string local_90 [32];
  double *local_70;
  double local_8;
  
  bits = (uint)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  local_8 = in_RDI;
  MonteCarloCrossSection::MonteCarloCrossSection
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  paVar5 = &local_91;
  dVar3 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"cross-section",paVar5);
  boost::program_options::variables_map::operator[]
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  pdVar1 = boost::program_options::variable_value::as<double>((variable_value *)0x136257);
  pdVar1 = (double *)*pdVar1;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  local_70 = pdVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"constit-width",&local_d1);
  bx = boost::program_options::variables_map::operator[]
                 (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  max_iter_00 = boost::program_options::variable_value::as<double>((variable_value *)0x1362f3);
  dVar2 = *max_iter_00;
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  local_b0 = dVar2;
  boost::math::tools::eps_tolerance<double>::eps_tolerance(in_stack_fffffffffffffe50,bits);
  dVar2 = sqr<double>(&local_b0);
  f.mc_cross_section = (MonteCarloCrossSection *)paVar5;
  f.sigma_nn = (double *)dVar3;
  f.c = in_stack_fffffffffffffec0;
  pVar4 = boost::math::tools::
          toms748_solve<trento::(anonymous_namespace)::numeric_partonic_cross_section(boost::program_options::variables_map_const&)::__0,double,boost::math::tools::eps_tolerance<double>>
                    (f,pdVar1,(double *)bx,(eps_tolerance<double>)local_8,(uintmax_t *)max_iter_00);
  dVar3 = exp((pVar4.first + pVar4.second) * 0.5);
  return dVar3 * dVar2 * 12.566370614359172;
}

Assistant:

double numeric_partonic_cross_section(const VarMap& var_map) {
  MonteCarloCrossSection mc_cross_section(var_map);
  auto sigma_nn = var_map["cross-section"].as<double>();
  auto width = var_map["constit-width"].as<double>();

  // Bracket min and max.
  auto a = -10.;
  auto b = 20.;

  // Tolerance function.
  math::tools::eps_tolerance<double> tol{8};

  // Maximum iterations.
  boost::uintmax_t max_iter = 20;

  // Dimensional constant [fm^-1] used to rescale sigma_partonic
  auto c = 4 * math::double_constants::pi * sqr(width);

  try {
    auto result = math::tools::toms748_solve(
      [&sigma_nn, &mc_cross_section, &c](double cross_section_param) {
        auto x = std::exp(cross_section_param) * c;
        return mc_cross_section(x) - sigma_nn;
      },
      a, b, tol, max_iter);

    auto cross_section_param = .5*(result.first + result.second);
    return std::exp(cross_section_param) * c;
  }
  catch (const std::domain_error&) {
    // Root finding fails for very small nucleon widths, w^2/sigma_nn < ~0.01.
    throw std::domain_error{
      "unable to fit cross section -- nucleon and/or constituent width too small?"};
  }
}